

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# user_geometry_device.cpp
# Opt level: O0

void embree::sphereBoundsFunc(RTCBoundsFunctionArguments *args)

{
  uint uVar1;
  void *pvVar2;
  RTCBounds *pRVar3;
  Sphere *sphere;
  RTCBounds *bounds_o;
  Sphere *spheres;
  RTCBoundsFunctionArguments *args_local;
  
  pvVar2 = args->geometryUserPtr;
  pRVar3 = args->bounds_o;
  uVar1 = args->primID;
  pRVar3->lower_x =
       *(float *)((long)pvVar2 + (ulong)uVar1 * 0x40 + 0x10) -
       *(float *)((long)pvVar2 + (ulong)uVar1 * 0x40 + 0x20);
  pRVar3->lower_y =
       *(float *)((long)pvVar2 + (ulong)uVar1 * 0x40 + 0x14) -
       *(float *)((long)pvVar2 + (ulong)uVar1 * 0x40 + 0x20);
  pRVar3->lower_z =
       *(float *)((long)pvVar2 + (ulong)uVar1 * 0x40 + 0x18) -
       *(float *)((long)pvVar2 + (ulong)uVar1 * 0x40 + 0x20);
  pRVar3->upper_x =
       *(float *)((long)pvVar2 + (ulong)uVar1 * 0x40 + 0x10) +
       *(float *)((long)pvVar2 + (ulong)uVar1 * 0x40 + 0x20);
  pRVar3->upper_y =
       *(float *)((long)pvVar2 + (ulong)uVar1 * 0x40 + 0x14) +
       *(float *)((long)pvVar2 + (ulong)uVar1 * 0x40 + 0x20);
  pRVar3->upper_z =
       *(float *)((long)pvVar2 + (ulong)uVar1 * 0x40 + 0x18) +
       *(float *)((long)pvVar2 + (ulong)uVar1 * 0x40 + 0x20);
  return;
}

Assistant:

void sphereBoundsFunc(const struct RTCBoundsFunctionArguments* args)
{
  const Sphere* spheres = (const Sphere*) args->geometryUserPtr;
  RTCBounds* bounds_o = args->bounds_o;
  const Sphere& sphere = spheres[args->primID];
  bounds_o->lower_x = sphere.p.x-sphere.r;
  bounds_o->lower_y = sphere.p.y-sphere.r;
  bounds_o->lower_z = sphere.p.z-sphere.r;
  bounds_o->upper_x = sphere.p.x+sphere.r;
  bounds_o->upper_y = sphere.p.y+sphere.r;
  bounds_o->upper_z = sphere.p.z+sphere.r;
}